

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

void __thiscall
slang::ast::Compilation::checkDPIMethods
          (Compilation *this,
          span<const_slang::ast::SubroutineSymbol_*const,_18446744073709551615UL> dpiImports)

{
  pointer ppSVar1;
  group_type_pointer pgVar2;
  group_type_pointer pgVar3;
  group_type_pointer pgVar4;
  int iVar5;
  undefined4 uVar6;
  Scope *this_00;
  SyntaxNode *pSVar7;
  Scope *scope;
  SyntaxNode *pSVar8;
  long lVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  byte bVar12;
  group_type_pointer pgVar13;
  value_type_pointer ppVar14;
  value_type_pointer ppVar15;
  group_type_pointer pgVar16;
  value_type_pointer ppVar17;
  bool bVar18;
  uint uVar19;
  uint64_t uVar20;
  Diagnostic *pDVar21;
  pointer ppVar22;
  _Head_base<1UL,_const_slang::ast::Scope_*,_false> this_01;
  Type *pTVar23;
  SourceLocation SVar24;
  size_t hash;
  value_type *elements;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  pointer ppSVar28;
  ulong uVar29;
  basic_string_view<char,_std::char_traits<char>_> *in_R9;
  Info *args_1;
  ulong uVar30;
  value_type_pointer ppVar31;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*> *__u;
  uchar uVar32;
  uchar uVar36;
  uchar uVar37;
  byte bVar38;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar39 [16];
  Token TVar40;
  string_view sVar41;
  SourceRange SVar42;
  ArgList AVar43;
  Token cid;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  Token name;
  Token name_00;
  LookupLocation location;
  try_emplace_args_t local_1c9;
  Info local_1c8;
  string_view cId_1;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*> local_178;
  flat_hash_map<std::string_view,_const_SubroutineSymbol_*> nameMap;
  SubroutineSymbol *sub;
  flat_hash_map<const_SubroutineSymbol_*,_const_DPIExportSyntax_*> previousExports;
  vector<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
  exports;
  flat_hash_map<std::tuple<std::string_view,_const_Scope_*>,_const_DPIExportSyntax_*> exportsByScope
  ;
  
  ppSVar28 = dpiImports._M_ptr;
  boost::unordered::
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
  ::unordered_flat_map(&nameMap);
  ppSVar1 = ppSVar28 + dpiImports._M_extent._M_extent_value._M_extent_value;
  for (; ppSVar28 != ppSVar1; ppSVar28 = ppSVar28 + 1) {
    sub = *ppSVar28;
    this_00 = (sub->super_Symbol).parentScope;
    pSVar7 = (sub->super_Symbol).originatingSyntax;
    scope = (Scope *)pSVar7[5].parent;
    pSVar8 = pSVar7[5].previewNode;
    TVar40 = slang::syntax::SyntaxNode::getLastToken(*(SyntaxNode **)(pSVar7[6].previewNode + 5));
    cid.info = TVar40._0_8_;
    cid._0_8_ = pSVar8;
    name.info = (Info *)in_R9;
    name._0_8_ = TVar40.info;
    previousExports.table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
    .arrays._0_16_ =
         checkDPIMethods::anon_class_1_0_00000001::operator()
                   ((anon_class_1_0_00000001 *)this_00,scope,cid,name);
    if (previousExports.table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
        .arrays.groups_size_index != 0) {
      uVar20 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                         ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                          &nameMap,(basic_string_view<char,_std::char_traits<char>_> *)
                                   &previousExports);
      uVar27 = uVar20 >> ((byte)nameMap.table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
                                .arrays.groups_size_index & 0x3f);
      lVar25 = (uVar20 & 0xff) * 4;
      uVar32 = (&UNK_0049e39c)[lVar25];
      uVar36 = (&UNK_0049e39d)[lVar25];
      uVar37 = (&UNK_0049e39e)[lVar25];
      bVar12 = (&UNK_0049e39f)[lVar25];
      uVar29 = 0;
      uVar26 = uVar27;
      do {
        ppVar14 = nameMap.table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
                  .arrays.elements_;
        pgVar13 = nameMap.table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
                  .arrays.groups_;
        pgVar2 = nameMap.table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
                 .arrays.groups_ + uVar26;
        bVar38 = pgVar2->m[0xf].n;
        auVar33[0] = -(pgVar2->m[0].n == uVar32);
        auVar33[1] = -(pgVar2->m[1].n == uVar36);
        auVar33[2] = -(pgVar2->m[2].n == uVar37);
        auVar33[3] = -(pgVar2->m[3].n == bVar12);
        auVar33[4] = -(pgVar2->m[4].n == uVar32);
        auVar33[5] = -(pgVar2->m[5].n == uVar36);
        auVar33[6] = -(pgVar2->m[6].n == uVar37);
        auVar33[7] = -(pgVar2->m[7].n == bVar12);
        auVar33[8] = -(pgVar2->m[8].n == uVar32);
        auVar33[9] = -(pgVar2->m[9].n == uVar36);
        auVar33[10] = -(pgVar2->m[10].n == uVar37);
        auVar33[0xb] = -(pgVar2->m[0xb].n == bVar12);
        auVar33[0xc] = -(pgVar2->m[0xc].n == uVar32);
        auVar33[0xd] = -(pgVar2->m[0xd].n == uVar36);
        auVar33[0xe] = -(pgVar2->m[0xe].n == uVar37);
        auVar33[0xf] = -(bVar38 == bVar12);
        uVar19 = (uint)(ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe);
        if (uVar19 != 0) {
          do {
            uVar10 = 0;
            if (uVar19 != 0) {
              for (; (uVar19 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
              }
            }
            ppVar31 = ppVar14 + uVar26 * 0xf + (ulong)uVar10;
            bVar18 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                     operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                                &nameMap,(basic_string_view<char,_std::char_traits<char>_> *)
                                         &previousExports,&ppVar31->first);
            if (bVar18) {
              bVar18 = checkSignaturesMatch(sub,ppVar31->second);
              if (!bVar18) {
                pDVar21 = Scope::addDiag(this_00,(DiagCode)0x8000d,(sub->super_Symbol).location);
                Diagnostic::operator<<
                          (pDVar21,(string_view)
                                   previousExports.table_.
                                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                                   .arrays._0_16_);
                Diagnostic::addNote(pDVar21,(DiagCode)0xa0001,
                                    (ppVar31->second->super_Symbol).location);
              }
              goto LAB_00386da8;
            }
            uVar19 = uVar19 - 1 & uVar19;
          } while (uVar19 != 0);
          bVar38 = pgVar13[uVar26].m[0xf].n;
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)uVar20 & 7] & bVar38) == 0) break;
        lVar25 = uVar26 + uVar29;
        uVar29 = uVar29 + 1;
        uVar26 = lVar25 + 1U &
                 nameMap.table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
                 .arrays.groups_size_mask;
      } while (uVar29 <= nameMap.table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
                         .arrays.groups_size_mask);
      if (nameMap.table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
          .size_ctrl.size <
          nameMap.table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
          .size_ctrl.ml) {
        in_R9 = (basic_string_view<char,_std::char_traits<char>_> *)&previousExports;
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SubroutineSymbol_const*>>>
        ::
        unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::ast::SubroutineSymbol_const*&>
                  ((locator *)&exportsByScope,
                   (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SubroutineSymbol_const*>>>
                    *)&nameMap,uVar27,uVar20,(try_emplace_args_t *)&exports,in_R9,&sub);
      }
      else {
        in_R9 = (basic_string_view<char,_std::char_traits<char>_> *)&sub;
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SubroutineSymbol_const*>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::ast::SubroutineSymbol_const*&>
                  ((locator *)&exportsByScope,
                   (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SubroutineSymbol_const*>>>
                    *)&nameMap,uVar20,(try_emplace_args_t *)&exports,
                   (basic_string_view<char,_std::char_traits<char>_> *)&previousExports,
                   (SubroutineSymbol **)in_R9);
      }
    }
LAB_00386da8:
  }
  boost::unordered::
  unordered_flat_map<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
  ::unordered_flat_map(&exportsByScope);
  boost::unordered::
  unordered_flat_map<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
  ::unordered_flat_map(&previousExports);
  std::
  vector<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
  ::vector(&exports,&this->dpiExports);
  ppVar22 = exports.
            super__Vector_base<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppVar22 ==
        exports.
        super__Vector_base<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      _Vector_base<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
      ::~_Vector_base(&exports.
                       super__Vector_base<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
                     );
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
      ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::SubroutineSymbol_*,_void>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                     *)&previousExports);
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
      ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                     *)&exportsByScope);
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
      ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::SubroutineSymbol_*>_>_>
                     *)&nameMap);
      return;
    }
    local_1c8.rawTextPtr = (char *)ppVar22->first;
    local_1c8.location = (SourceLocation)ppVar22->second;
    sVar41 = parsing::Token::valueText(&((DPIExportSyntax *)local_1c8.rawTextPtr)->specString);
    __y._M_str = "DPI";
    __y._M_len = 3;
    bVar18 = std::operator==(sVar41,__y);
    SVar24 = local_1c8.location;
    if (bVar18) {
      SVar42 = parsing::Token::range((Token *)((long)local_1c8.rawTextPtr + 0x60));
      Scope::addDiag((Scope *)SVar24,(DiagCode)0xea0006,SVar42);
    }
    sVar41 = parsing::Token::valueText((Token *)((long)local_1c8.rawTextPtr + 0xa0));
    SVar24 = local_1c8.location;
    SVar42 = parsing::Token::range((Token *)((long)local_1c8.rawTextPtr + 0xa0));
    location._12_4_ = 0;
    location.scope = (Scope *)SUB128(ZEXT412(0xffffffff) << 0x40,0);
    location.index = SUB124(ZEXT412(0xffffffff) << 0x40,8);
    this_01._M_head_impl =
         (Scope *)Lookup::unqualifiedAt
                            ((Scope *)SVar24,sVar41,location,SVar42,
                             (bitmask<slang::ast::LookupFlags>)0x0);
    SVar24 = local_1c8.location;
    if ((SourceLocation)this_01._M_head_impl != (SourceLocation)0x0) {
      if (((Symbol *)&(this_01._M_head_impl)->compilation)->kind == Subroutine) {
        iVar5 = *(int *)((long)&this_01._M_head_impl[3].nameMap + 4);
        if (iVar5 == 1) {
          if (((Token *)((long)local_1c8.rawTextPtr + 0x90))->kind != FunctionKeyword)
          goto LAB_00386fe7;
        }
        else if ((iVar5 != 0) ||
                (((Token *)((long)local_1c8.rawTextPtr + 0x90))->kind != TaskKeyword)) {
LAB_00386fe7:
          if ((SourceLocation)(this_01._M_head_impl)->lastMember == local_1c8.location) {
            if (((ulong)this_01._M_head_impl[3].firstMember & 0x8000000000) == 0) {
              pTVar23 = DeclaredType::getType((DeclaredType *)&this_01._M_head_impl[2].thisSym);
              bVar18 = Type::isValidForDPIReturn(pTVar23);
              if ((bVar18) || (bVar18 = Type::isError(pTVar23), bVar18)) {
                AVar43 = SubroutineSymbol::getArguments((SubroutineSymbol *)this_01._M_head_impl);
                for (lVar25 = 0;
                    ppVar15 = previousExports.table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                              .arrays.elements_, SVar24 = local_1c8.location,
                    AVar43._M_extent._M_extent_value._M_extent_value << 3 != lVar25;
                    lVar25 = lVar25 + 8) {
                  lVar9 = *(long *)((long)AVar43._M_ptr + lVar25);
                  if (*(int *)(lVar9 + 0x158) == 3) {
                    Scope::addDiag((Scope *)local_1c8.location,(DiagCode)0x270006,
                                   *(SourceLocation *)(lVar9 + 0x18));
                  }
                  pTVar23 = DeclaredType::getType((DeclaredType *)(lVar9 + 0x40));
                  bVar18 = Type::isValidForDPIArg(pTVar23);
                  if ((!bVar18) && (bVar18 = Type::isError(pTVar23), !bVar18)) {
                    pDVar21 = Scope::addDiag((Scope *)local_1c8.location,(DiagCode)0x560006,
                                             *(SourceLocation *)(lVar9 + 0x18));
                    ast::operator<<(pDVar21,pTVar23);
                    SVar24 = parsing::Token::location((Token *)((long)local_1c8.rawTextPtr + 0xa0));
                    Diagnostic::addNote(pDVar21,(DiagCode)0x50001,SVar24);
                  }
                }
                auVar11._8_8_ = 0;
                auVar11._0_8_ = this_01._M_head_impl;
                uVar29 = SUB168(auVar11 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                         SUB168(auVar11 * ZEXT816(0x9e3779b97f4a7c15),0);
                uVar27 = uVar29 >> ((byte)previousExports.table_.
                                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                                          .arrays.groups_size_index & 0x3f);
                uVar6 = (&boost::unordered::detail::foa::
                          group15<boost::unordered::detail::foa::plain_integral>::
                          match_word(unsigned_long)::word)[uVar29 & 0xff];
                uVar30 = 0;
                uVar26 = uVar27;
                do {
                  pgVar3 = previousExports.table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                           .arrays.groups_ + uVar26;
                  bVar12 = pgVar3->m[0xf].n;
                  uVar32 = (uchar)uVar6;
                  auVar39[0] = -(pgVar3->m[0].n == uVar32);
                  uVar36 = (uchar)((uint)uVar6 >> 8);
                  auVar39[1] = -(pgVar3->m[1].n == uVar36);
                  uVar37 = (uchar)((uint)uVar6 >> 0x10);
                  auVar39[2] = -(pgVar3->m[2].n == uVar37);
                  bVar38 = (byte)((uint)uVar6 >> 0x18);
                  auVar39[3] = -(pgVar3->m[3].n == bVar38);
                  auVar39[4] = -(pgVar3->m[4].n == uVar32);
                  auVar39[5] = -(pgVar3->m[5].n == uVar36);
                  auVar39[6] = -(pgVar3->m[6].n == uVar37);
                  auVar39[7] = -(pgVar3->m[7].n == bVar38);
                  auVar39[8] = -(pgVar3->m[8].n == uVar32);
                  auVar39[9] = -(pgVar3->m[9].n == uVar36);
                  auVar39[10] = -(pgVar3->m[10].n == uVar37);
                  auVar39[0xb] = -(pgVar3->m[0xb].n == bVar38);
                  auVar39[0xc] = -(pgVar3->m[0xc].n == uVar32);
                  auVar39[0xd] = -(pgVar3->m[0xd].n == uVar36);
                  auVar39[0xe] = -(pgVar3->m[0xe].n == uVar37);
                  auVar39[0xf] = -(bVar12 == bVar38);
                  for (uVar19 = (uint)(ushort)((ushort)(SUB161(auVar39 >> 7,0) & 1) |
                                               (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1 |
                                               (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                                               (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                                               (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                                               (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                                               (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                                               (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
                                               (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
                                               (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
                                               (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
                                               (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
                                               (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
                                               (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
                                              (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe);
                      local_178.
                      super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                      .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                      super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
                           (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)
                           (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)this_01._M_head_impl,
                      uVar19 != 0; uVar19 = uVar19 - 1 & uVar19) {
                    iVar5 = 0;
                    if (uVar19 != 0) {
                      for (; (uVar19 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
                      }
                    }
                    if ((SourceLocation)this_01._M_head_impl ==
                        *(SourceLocation *)
                         ((long)&previousExports.table_.
                                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                                 .arrays.elements_[uVar26 * 0xf].first + (ulong)(uint)(iVar5 << 4)))
                    {
                      SVar42 = parsing::Token::range((Token *)((long)local_1c8.rawTextPtr + 0xa0));
                      pDVar21 = Scope::addDiag((Scope *)SVar24,(DiagCode)0x4000d,SVar42);
                      pDVar21 = Diagnostic::operator<<
                                          (pDVar21,*(string_view *)&(this_01._M_head_impl)->thisSym)
                      ;
                      SVar24 = parsing::Token::location
                                         ((Token *)(*(long *)((long)&ppVar15[uVar26 * 0xf].second +
                                                             (ulong)(uint)(iVar5 << 4)) + 0xa0));
                      Diagnostic::addNote(pDVar21,(DiagCode)0xa0001,SVar24);
                      goto LAB_00387713;
                    }
                  }
                  if (((&boost::unordered::detail::foa::
                         group15<boost::unordered::detail::foa::plain_integral>::
                         is_not_overflowed(unsigned_long)::shift)[(uint)uVar29 & 7] & bVar12) == 0)
                  break;
                  lVar25 = uVar26 + uVar30;
                  uVar30 = uVar30 + 1;
                  uVar26 = lVar25 + 1U &
                           previousExports.table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                           .arrays.groups_size_mask;
                } while (uVar30 <= previousExports.table_.
                                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                                   .arrays.groups_size_mask);
                if (previousExports.table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                    .size_ctrl.size <
                    previousExports.table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                    .size_ctrl.ml) {
                  args_1 = (Info *)&local_178;
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::SubroutineSymbol_const*,slang::syntax::DPIExportSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,std::allocator<std::pair<slang::ast::SubroutineSymbol_const*const,slang::syntax::DPIExportSyntax_const*>>>
                  ::
                  unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::SubroutineSymbol_const*,slang::syntax::DPIExportSyntax_const*&>
                            ((locator *)&sub,
                             (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::SubroutineSymbol_const*,slang::syntax::DPIExportSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,std::allocator<std::pair<slang::ast::SubroutineSymbol_const*const,slang::syntax::DPIExportSyntax_const*>>>
                              *)&previousExports,uVar27,uVar29,(try_emplace_args_t *)&cId_1,
                             (SubroutineSymbol **)args_1,(DPIExportSyntax **)&local_1c8);
                }
                else {
                  args_1 = &local_1c8;
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::SubroutineSymbol_const*,slang::syntax::DPIExportSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,std::allocator<std::pair<slang::ast::SubroutineSymbol_const*const,slang::syntax::DPIExportSyntax_const*>>>
                  ::
                  unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::SubroutineSymbol_const*,slang::syntax::DPIExportSyntax_const*&>
                            ((locator *)&sub,
                             (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::SubroutineSymbol_const*,slang::syntax::DPIExportSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,std::allocator<std::pair<slang::ast::SubroutineSymbol_const*const,slang::syntax::DPIExportSyntax_const*>>>
                              *)&previousExports,uVar29,(try_emplace_args_t *)&cId_1,
                             (SubroutineSymbol **)&local_178,(DPIExportSyntax **)args_1);
                }
                TVar40.info = *(Info **)((long)local_1c8.rawTextPtr + 0xa0);
                TVar40._0_8_ = ((Token *)((long)local_1c8.rawTextPtr + 0x70))->info;
                name_00.info = args_1;
                name_00._0_8_ = ((Token *)((long)local_1c8.rawTextPtr + 0xa0))->info;
                cId_1 = checkDPIMethods::anon_class_1_0_00000001::operator()
                                  ((anon_class_1_0_00000001 *)local_1c8.location,
                                   *(Scope **)((long)local_1c8.rawTextPtr + 0x70),TVar40,name_00);
                if (cId_1._M_len != 0) {
                  local_178.
                  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                  .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                  super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
                       (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)
                       (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)this_01._M_head_impl;
                  uVar20 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                           operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                       *)&nameMap,&cId_1);
                  uVar27 = uVar20 >> ((byte)nameMap.table_.
                                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
                                            .arrays.groups_size_index & 0x3f);
                  lVar25 = (uVar20 & 0xff) * 4;
                  uVar32 = (&UNK_0049e39c)[lVar25];
                  uVar36 = (&UNK_0049e39d)[lVar25];
                  uVar37 = (&UNK_0049e39e)[lVar25];
                  bVar12 = (&UNK_0049e39f)[lVar25];
                  uVar29 = 0;
                  uVar26 = uVar27;
                  do {
                    ppVar14 = nameMap.table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
                              .arrays.elements_;
                    pgVar13 = nameMap.table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
                              .arrays.groups_;
                    pgVar2 = nameMap.table_.
                             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
                             .arrays.groups_ + uVar26;
                    bVar38 = pgVar2->m[0xf].n;
                    auVar34[0] = -(pgVar2->m[0].n == uVar32);
                    auVar34[1] = -(pgVar2->m[1].n == uVar36);
                    auVar34[2] = -(pgVar2->m[2].n == uVar37);
                    auVar34[3] = -(pgVar2->m[3].n == bVar12);
                    auVar34[4] = -(pgVar2->m[4].n == uVar32);
                    auVar34[5] = -(pgVar2->m[5].n == uVar36);
                    auVar34[6] = -(pgVar2->m[6].n == uVar37);
                    auVar34[7] = -(pgVar2->m[7].n == bVar12);
                    auVar34[8] = -(pgVar2->m[8].n == uVar32);
                    auVar34[9] = -(pgVar2->m[9].n == uVar36);
                    auVar34[10] = -(pgVar2->m[10].n == uVar37);
                    auVar34[0xb] = -(pgVar2->m[0xb].n == bVar12);
                    auVar34[0xc] = -(pgVar2->m[0xc].n == uVar32);
                    auVar34[0xd] = -(pgVar2->m[0xd].n == uVar36);
                    auVar34[0xe] = -(pgVar2->m[0xe].n == uVar37);
                    auVar34[0xf] = -(bVar38 == bVar12);
                    uVar19 = (uint)(ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) |
                                            (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1 |
                                            (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                                            (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                                            (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                                            (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                                            (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                                            (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                                            (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                                            (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                                            (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                                            (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                                            (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                                            (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                                           (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe);
                    if (uVar19 != 0) {
                      do {
                        uVar10 = 0;
                        if (uVar19 != 0) {
                          for (; (uVar19 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
                          }
                        }
                        ppVar31 = ppVar14 + uVar26 * 0xf + (ulong)uVar10;
                        bVar18 = std::
                                 equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                                 operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                             *)&nameMap,&cId_1,&ppVar31->first);
                        if (bVar18) {
                          bVar18 = checkSignaturesMatch
                                             ((SubroutineSymbol *)this_01._M_head_impl,
                                              ppVar31->second);
                          SVar24 = local_1c8.location;
                          if (!bVar18) {
                            SVar42 = parsing::Token::range
                                               ((Token *)((long)local_1c8.rawTextPtr + 0xa0));
                            pDVar21 = Scope::addDiag((Scope *)SVar24,(DiagCode)0x8000d,SVar42);
                            Diagnostic::operator<<(pDVar21,cId_1);
                            Diagnostic::addNote(pDVar21,(DiagCode)0xa0001,
                                                (ppVar31->second->super_Symbol).location);
                          }
                          goto LAB_0038752e;
                        }
                        uVar19 = uVar19 - 1 & uVar19;
                      } while (uVar19 != 0);
                      bVar38 = pgVar13[uVar26].m[0xf].n;
                    }
                    if (((&boost::unordered::detail::foa::
                           group15<boost::unordered::detail::foa::plain_integral>::
                           is_not_overflowed(unsigned_long)::shift)[(uint)uVar20 & 7] & bVar38) == 0
                       ) break;
                    lVar25 = uVar26 + uVar29;
                    uVar29 = uVar29 + 1;
                    uVar26 = lVar25 + 1U &
                             nameMap.table_.
                             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
                             .arrays.groups_size_mask;
                  } while (uVar29 <= nameMap.table_.
                                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
                                     .arrays.groups_size_mask);
                  if (nameMap.table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
                      .size_ctrl.size <
                      nameMap.table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
                      .size_ctrl.ml) {
                    boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SubroutineSymbol_const*>>>
                    ::
                    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::ast::SubroutineSymbol_const*>
                              ((locator *)&sub,
                               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SubroutineSymbol_const*>>>
                                *)&nameMap,uVar27,uVar20,&local_1c9,&cId_1,
                               (SubroutineSymbol **)&local_178);
                  }
                  else {
                    boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SubroutineSymbol_const*>>>
                    ::
                    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::ast::SubroutineSymbol_const*>
                              ((locator *)&sub,
                               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SubroutineSymbol_const*>>>
                                *)&nameMap,uVar20,&local_1c9,&cId_1,(SubroutineSymbol **)&local_178)
                    ;
                  }
LAB_0038752e:
                  local_178.
                  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                  .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                  super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
                       (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)
                       (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)local_1c8.location;
                  local_178.
                  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                  .
                  super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                  ._M_head_impl._M_len = cId_1._M_len;
                  local_178.
                  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                  .
                  super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                  ._M_head_impl._M_str = cId_1._M_str;
                  hash = boost::unordered::detail::foa::mulx_mix::
                         mix<slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>
                                   ((hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>
                                     *)&exportsByScope,&local_178);
                  uVar29 = hash >> ((byte)exportsByScope.table_.
                                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                                          .arrays.groups_size_index & 0x3f);
                  lVar25 = (hash & 0xff) * 4;
                  uVar32 = (&UNK_0049e39c)[lVar25];
                  uVar36 = (&UNK_0049e39d)[lVar25];
                  uVar37 = (&UNK_0049e39e)[lVar25];
                  bVar12 = (&UNK_0049e39f)[lVar25];
                  uVar27 = 0;
                  uVar26 = uVar29;
                  do {
                    ppVar17 = exportsByScope.table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                              .arrays.elements_;
                    pgVar16 = exportsByScope.table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                              .arrays.groups_;
                    pgVar4 = exportsByScope.table_.
                             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                             .arrays.groups_ + uVar26;
                    bVar38 = pgVar4->m[0xf].n;
                    auVar35[0] = -(pgVar4->m[0].n == uVar32);
                    auVar35[1] = -(pgVar4->m[1].n == uVar36);
                    auVar35[2] = -(pgVar4->m[2].n == uVar37);
                    auVar35[3] = -(pgVar4->m[3].n == bVar12);
                    auVar35[4] = -(pgVar4->m[4].n == uVar32);
                    auVar35[5] = -(pgVar4->m[5].n == uVar36);
                    auVar35[6] = -(pgVar4->m[6].n == uVar37);
                    auVar35[7] = -(pgVar4->m[7].n == bVar12);
                    auVar35[8] = -(pgVar4->m[8].n == uVar32);
                    auVar35[9] = -(pgVar4->m[9].n == uVar36);
                    auVar35[10] = -(pgVar4->m[10].n == uVar37);
                    auVar35[0xb] = -(pgVar4->m[0xb].n == bVar12);
                    auVar35[0xc] = -(pgVar4->m[0xc].n == uVar32);
                    auVar35[0xd] = -(pgVar4->m[0xd].n == uVar36);
                    auVar35[0xe] = -(pgVar4->m[0xe].n == uVar37);
                    auVar35[0xf] = -(bVar38 == bVar12);
                    uVar19 = (uint)(ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) |
                                            (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
                                            (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                                            (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                                            (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                                            (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                                            (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                                            (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                                            (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                                            (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                                            (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                                            (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                                            (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                                            (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                                           (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe);
                    if (uVar19 != 0) {
                      do {
                        iVar5 = 0;
                        if (uVar19 != 0) {
                          for (; (uVar19 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
                          }
                        }
                        __u = (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                               *)((long)&ppVar17[uVar26 * 0xf].first.
                                         super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                         .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                                         super__Head_base<1UL,_const_slang::ast::Scope_*,_false>.
                                         _M_head_impl + (ulong)(uint)(iVar5 << 5));
                        bVar18 = std::
                                 __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_2UL>
                                 ::__eq(&local_178,__u);
                        SVar24 = local_1c8.location;
                        if (bVar18) {
                          SVar42 = parsing::Token::range
                                             ((Token *)((long)local_1c8.rawTextPtr + 0xa0));
                          pDVar21 = Scope::addDiag((Scope *)SVar24,(DiagCode)0x5000d,SVar42);
                          Diagnostic::operator<<(pDVar21,cId_1);
                          SVar24 = parsing::Token::location
                                             ((Token *)&__u[1].
                                                  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                                  .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>
                                                  .
                                                  super__Head_base<1UL,_const_slang::ast::Scope_*,_false>
                                                  ._M_head_impl[2].importData);
                          Diagnostic::addNote(pDVar21,(DiagCode)0xa0001,SVar24);
                          goto LAB_00387713;
                        }
                        uVar19 = uVar19 - 1 & uVar19;
                      } while (uVar19 != 0);
                      bVar38 = pgVar16[uVar26].m[0xf].n;
                    }
                    if (((&boost::unordered::detail::foa::
                           group15<boost::unordered::detail::foa::plain_integral>::
                           is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bVar38) == 0)
                    break;
                    lVar25 = uVar26 + uVar27;
                    uVar27 = uVar27 + 1;
                    uVar26 = lVar25 + 1U &
                             exportsByScope.table_.
                             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                             .arrays.groups_size_mask;
                  } while (uVar27 <= exportsByScope.table_.
                                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                                     .arrays.groups_size_mask);
                  if (exportsByScope.table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                      .size_ctrl.size <
                      exportsByScope.table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                      .size_ctrl.ml) {
                    boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::DPIExportSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,slang::syntax::DPIExportSyntax_const*>>>
                    ::
                    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::DPIExportSyntax_const*&>
                              ((locator *)&sub,
                               (table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::DPIExportSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,slang::syntax::DPIExportSyntax_const*>>>
                                *)&exportsByScope,uVar29,hash,&local_1c9,&local_178,
                               (DPIExportSyntax **)&local_1c8);
                  }
                  else {
                    boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::DPIExportSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,slang::syntax::DPIExportSyntax_const*>>>
                    ::
                    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::DPIExportSyntax_const*&>
                              ((locator *)&sub,
                               (table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::DPIExportSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,slang::syntax::DPIExportSyntax_const*>>>
                                *)&exportsByScope,hash,&local_1c9,&local_178,
                               (DPIExportSyntax **)&local_1c8);
                  }
                }
              }
              else {
                pDVar21 = Scope::addDiag((Scope *)local_1c8.location,(DiagCode)0x570006,
                                         *(SourceLocation *)&(this_01._M_head_impl)->firstMember);
                ast::operator<<(pDVar21,pTVar23);
                SVar24 = parsing::Token::location((Token *)((long)local_1c8.rawTextPtr + 0xa0));
                Diagnostic::addNote(pDVar21,(DiagCode)0x50001,SVar24);
              }
            }
            else {
              SVar42 = parsing::Token::range((Token *)((long)local_1c8.rawTextPtr + 0xa0));
              pDVar21 = Scope::addDiag((Scope *)SVar24,(DiagCode)0x6000d,SVar42);
              Diagnostic::addNote(pDVar21,(DiagCode)0x50001,
                                  *(SourceLocation *)&(this_01._M_head_impl)->firstMember);
            }
          }
          else {
            SVar42 = parsing::Token::range((Token *)((long)local_1c8.rawTextPtr + 0xa0));
            pDVar21 = Scope::addDiag((Scope *)SVar24,(DiagCode)0x3000d,SVar42);
            Diagnostic::addNote(pDVar21,(DiagCode)0x50001,
                                *(SourceLocation *)&(this_01._M_head_impl)->firstMember);
          }
          goto LAB_00387713;
        }
        SVar42 = parsing::Token::range((Token *)((long)local_1c8.rawTextPtr + 0x90));
        pDVar21 = Scope::addDiag((Scope *)SVar24,(DiagCode)0x7000d,SVar42);
        Diagnostic::addNote(pDVar21,(DiagCode)0x50001,
                            *(SourceLocation *)&(this_01._M_head_impl)->firstMember);
      }
      else {
        SVar42 = parsing::Token::range((Token *)((long)local_1c8.rawTextPtr + 0xa0));
        pDVar21 = Scope::addDiag((Scope *)SVar24,(DiagCode)0x23000a,SVar42);
        pDVar21 = Diagnostic::operator<<(pDVar21,sVar41);
        Diagnostic::addNote(pDVar21,(DiagCode)0x50001,
                            *(SourceLocation *)&(this_01._M_head_impl)->firstMember);
      }
    }
LAB_00387713:
    ppVar22 = ppVar22 + 1;
  } while( true );
}

Assistant:

void Compilation::checkDPIMethods(std::span<const SubroutineSymbol* const> dpiImports) {
    auto getCId = [&](const Scope& scope, Token cid, Token name) {
        std::string_view text = cid ? cid.valueText() : name.valueText();
        if (!text.empty()) {
            auto tail = text.substr(1);
            if (!isValidCIdChar(text[0]) || isDecimalDigit(text[0]) ||
                std::ranges::any_of(tail, [](char c) { return !isValidCIdChar(c); })) {
                scope.addDiag(diag::InvalidDPICIdentifier, cid ? cid.range() : name.range())
                    << text;
                return std::string_view();
            }
        }
        return text;
    };

    flat_hash_map<std::string_view, const SubroutineSymbol*> nameMap;
    for (auto sub : dpiImports) {
        auto syntax = sub->getSyntax();
        SLANG_ASSERT(syntax);

        auto scope = sub->getParentScope();
        SLANG_ASSERT(scope);

        auto& dis = syntax->as<DPIImportSyntax>();
        std::string_view cId = getCId(*scope, dis.c_identifier, dis.method->name->getLastToken());
        if (cId.empty())
            continue;

        auto [it, inserted] = nameMap.emplace(cId, sub);
        if (!inserted) {
            if (!checkSignaturesMatch(*sub, *it->second)) {
                auto& diag = scope->addDiag(diag::DPISignatureMismatch, sub->location);
                diag << cId;
                diag.addNote(diag::NotePreviousDefinition, it->second->location);
            }
        }
    }

    flat_hash_map<std::tuple<std::string_view, const Scope*>, const DPIExportSyntax*>
        exportsByScope;
    flat_hash_map<const SubroutineSymbol*, const DPIExportSyntax*> previousExports;
    auto exports = dpiExports;
    for (auto [syntax, scope] : exports) {
        if (syntax->specString.valueText() == "DPI")
            scope->addDiag(diag::DPISpecDisallowed, syntax->specString.range());

        auto name = syntax->name.valueText();
        auto symbol = Lookup::unqualifiedAt(*scope, name, LookupLocation::max,
                                            syntax->name.range());
        if (!symbol)
            continue;

        if (symbol->kind != SymbolKind::Subroutine) {
            auto& diag = scope->addDiag(diag::NotASubroutine, syntax->name.range()) << name;
            diag.addNote(diag::NoteDeclarationHere, symbol->location);
            continue;
        }

        // This check is a little verbose because we're avoiding issuing an error if the
        // functionOrTask keyword is invalid, i.e. not 'function' or 'task'.
        auto& sub = symbol->as<SubroutineSymbol>();
        if ((sub.subroutineKind == SubroutineKind::Function &&
             syntax->functionOrTask.kind == TokenKind::TaskKeyword) ||
            (sub.subroutineKind == SubroutineKind::Task &&
             syntax->functionOrTask.kind == TokenKind::FunctionKeyword)) {
            auto& diag = scope->addDiag(diag::DPIExportKindMismatch,
                                        syntax->functionOrTask.range());
            diag.addNote(diag::NoteDeclarationHere, symbol->location);
            continue;
        }

        if (sub.getParentScope() != scope) {
            auto& diag = scope->addDiag(diag::DPIExportDifferentScope, syntax->name.range());
            diag.addNote(diag::NoteDeclarationHere, sub.location);
            continue;
        }

        if (sub.flags.has(MethodFlags::DPIImport)) {
            auto& diag = scope->addDiag(diag::DPIExportImportedFunc, syntax->name.range());
            diag.addNote(diag::NoteDeclarationHere, sub.location);
            continue;
        }

        auto& retType = sub.getReturnType();
        if (!retType.isValidForDPIReturn() && !retType.isError()) {
            auto& diag = scope->addDiag(diag::InvalidDPIReturnType, sub.location);
            diag << retType;
            diag.addNote(diag::NoteDeclarationHere, syntax->name.location());
            continue;
        }

        for (auto arg : sub.getArguments()) {
            if (arg->direction == ArgumentDirection::Ref)
                scope->addDiag(diag::DPIRefArg, arg->location);

            auto& type = arg->getType();
            if (!type.isValidForDPIArg() && !type.isError()) {
                auto& diag = scope->addDiag(diag::InvalidDPIArgType, arg->location);
                diag << type;
                diag.addNote(diag::NoteDeclarationHere, syntax->name.location());
                continue;
            }
        }

        {
            auto [it, inserted] = previousExports.emplace(&sub, syntax);
            if (!inserted) {
                auto& diag = scope->addDiag(diag::DPIExportDuplicate, syntax->name.range())
                             << sub.name;
                diag.addNote(diag::NotePreviousDefinition, it->second->name.location());
                continue;
            }
        }

        std::string_view cId = getCId(*scope, syntax->c_identifier, syntax->name);
        if (!cId.empty()) {
            {
                auto [it, inserted] = nameMap.emplace(cId, &sub);
                if (!inserted) {
                    if (!checkSignaturesMatch(sub, *it->second)) {
                        auto& diag = scope->addDiag(diag::DPISignatureMismatch,
                                                    syntax->name.range());
                        diag << cId;
                        diag.addNote(diag::NotePreviousDefinition, it->second->location);
                    }
                }
            }
            {
                auto [it, inserted] = exportsByScope.emplace(std::make_tuple(cId, scope), syntax);
                if (!inserted) {
                    auto& diag = scope->addDiag(diag::DPIExportDuplicateCId, syntax->name.range());
                    diag << cId;
                    diag.addNote(diag::NotePreviousDefinition, it->second->name.location());
                }
            }
        }
    }
}